

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O1

MakefileGenerator * __thiscall MakefileGenerator::fileInfo(MakefileGenerator *this,QString file)

{
  char cVar1;
  QString *in_RDX;
  long in_FS_OFFSET;
  undefined1 *local_80;
  FileInfoCacheKey local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (fileInfo(QString)::noInfo == '\0') {
    fileInfo();
  }
  if (fileInfo::cache == (QHash<FileInfoCacheKey,_QFileInfo> *)0x0) {
    fileInfo::cache = (QHash<FileInfoCacheKey,_QFileInfo> *)operator_new(8);
    fileInfo::cache->d = (Data *)0x0;
    qmakeAddCacheClear(qmakeDeleteCacheClear<QHash<FileInfoCacheKey,QFileInfo>>,&fileInfo::cache);
  }
  local_78.pwd.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.pwd.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.pwd.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.file.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.file.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.hash = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  local_78.file.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  FileInfoCacheKey::FileInfoCacheKey(&local_78,in_RDX);
  local_80 = &DAT_aaaaaaaaaaaaaaaa;
  QHash<FileInfoCacheKey,_QFileInfo>::value
            ((QHash<FileInfoCacheKey,_QFileInfo> *)&local_80,(FileInfoCacheKey *)fileInfo::cache,
             (QFileInfo *)&local_78);
  cVar1 = comparesEqual((QFileInfo *)&local_80,(QFileInfo *)&fileInfo(QString)::noInfo);
  if (cVar1 == '\0') {
    QFileInfo::QFileInfo((QFileInfo *)this,(QFileInfo *)&local_80);
  }
  else {
    (this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo =
         (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
    QFileInfo::QFileInfo((QFileInfo *)this,(QString *)in_RDX);
    cVar1 = QFileInfo::exists();
    if (cVar1 != '\0') {
      QHash<FileInfoCacheKey,QFileInfo>::emplace<QFileInfo_const&>
                ((QHash<FileInfoCacheKey,QFileInfo> *)fileInfo::cache,&local_78,(QFileInfo *)this);
    }
  }
  QFileInfo::~QFileInfo((QFileInfo *)&local_80);
  if (&(local_78.pwd.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.pwd.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.pwd.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.pwd.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.pwd.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_78.file.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.file.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.file.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.file.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.file.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QFileInfo
MakefileGenerator::fileInfo(QString file) const
{
    Q_CONSTINIT static QHash<FileInfoCacheKey, QFileInfo> *cache = nullptr;
    static QFileInfo noInfo = QFileInfo();
    if(!cache) {
        cache = new QHash<FileInfoCacheKey, QFileInfo>;
        qmakeAddCacheClear(qmakeDeleteCacheClear<QHash<FileInfoCacheKey, QFileInfo> >, (void**)&cache);
    }
    FileInfoCacheKey cacheKey(file);
    QFileInfo value = cache->value(cacheKey, noInfo);
    if (value != noInfo)
        return value;

    QFileInfo fi(file);
    if (fi.exists())
        cache->insert(cacheKey, fi);
    return fi;
}